

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteV128Decl(CWriter *this)

{
  Newline local_1f;
  Newline local_1e;
  Newline local_1d;
  Newline local_1c;
  Newline local_1b;
  Newline local_1a;
  Newline local_19;
  CWriter *local_18;
  CWriter *this_local;
  
  local_18 = this;
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[32],wabt::(anonymous_namespace)::Newline,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [32])"#include <simde/wasm/simd128.h>",&local_19,&local_1a);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[34],wabt::(anonymous_namespace)::Newline,char_const(&)[34],wabt::(anonymous_namespace)::Newline,char_const(&)[27],wabt::(anonymous_namespace)::Newline,char_const(&)[7],wabt::(anonymous_namespace)::Newline,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [34])"#ifndef WASM_RT_SIMD_TYPE_DEFINED",&local_1b,
             (char (*) [34])"#define WASM_RT_SIMD_TYPE_DEFINED",&local_1c,
             (char (*) [27])"typedef simde_v128_t v128;",&local_1d,(char (*) [7])"#endif",&local_1e,
             &local_1f);
  return;
}

Assistant:

void CWriter::WriteV128Decl() {
  Write("#include <simde/wasm/simd128.h>", Newline(), Newline());
  Write("#ifndef WASM_RT_SIMD_TYPE_DEFINED", Newline(),
        "#define WASM_RT_SIMD_TYPE_DEFINED", Newline(),
        "typedef simde_v128_t v128;", Newline(), "#endif", Newline(),
        Newline());
}